

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O2

string * __thiscall
helics::errorMessageString_abi_cxx11_
          (string *__return_storage_ptr__,helics *this,ActionMessage *command)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  char *__s;
  allocator<char> local_9;
  
  if (((byte)this[0x1a] & 0x10) == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)emptyStr_abi_cxx11_
    ;
    if (0 < (int)((ulong)(*(long *)(this + 0xa8) -
                         (long)*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                 **)(this + 0xa0)) >> 5)) {
      __str = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 0xa0);
    }
    if (__str->_M_string_length == 0) {
      __s = commandErrorString(0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,__s,&local_9);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__,__str);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string errorMessageString(const ActionMessage& command)
{
    if (checkActionFlag(command, error_flag)) {
        const auto& estring = command.getString(0);
        if (estring.empty()) {
            return commandErrorString(command.messageID);
        }
        return estring;
    }
    return std::string{};
}